

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_defer_clear_queue(void)

{
  fio_defer_queue_block_s *pfVar1;
  fio_defer_queue_block_s *tmp;
  fio_lock_i ret;
  timespec local_28;
  
  LOCK();
  UNLOCK();
  local_28.tv_sec = CONCAT71(local_28.tv_sec._1_7_,task_queue_normal.lock);
  if (task_queue_normal.lock != '\0') {
    do {
      task_queue_normal.lock = '\x01';
      local_28.tv_sec = 0;
      local_28.tv_nsec = 1;
      nanosleep(&local_28,(timespec *)0x0);
      LOCK();
      UNLOCK();
      local_28.tv_sec = CONCAT71(local_28.tv_sec._1_7_,task_queue_normal.lock);
    } while (task_queue_normal.lock != '\0');
  }
  task_queue_normal.lock = '\x01';
  while (pfVar1 = task_queue_normal.reader, pfVar1 != (fio_defer_queue_block_s *)0x0) {
    task_queue_normal.reader = pfVar1->next;
    if (pfVar1 != &task_queue_normal.static_queue) {
      free(pfVar1);
    }
  }
  task_queue_normal.reader = pfVar1;
  memset(&task_queue_normal.static_queue,0,0xfe0);
  task_queue_normal.writer = &task_queue_normal.static_queue;
  task_queue_normal.reader = &task_queue_normal.static_queue;
  LOCK();
  task_queue_normal.lock = '\0';
  UNLOCK();
  LOCK();
  UNLOCK();
  local_28.tv_sec = CONCAT71((int7)((ulong)local_28.tv_sec >> 8),task_queue_urgent.lock);
  while (task_queue_urgent.lock != '\0') {
    task_queue_urgent.lock = '\x01';
    local_28.tv_sec = 0;
    local_28.tv_nsec = 1;
    nanosleep(&local_28,(timespec *)0x0);
    LOCK();
    UNLOCK();
    local_28.tv_sec = CONCAT71(local_28.tv_sec._1_7_,task_queue_urgent.lock);
  }
  task_queue_urgent.lock = '\x01';
  while (pfVar1 = task_queue_urgent.reader, pfVar1 != (fio_defer_queue_block_s *)0x0) {
    task_queue_urgent.reader = pfVar1->next;
    if (pfVar1 != &task_queue_urgent.static_queue) {
      free(pfVar1);
    }
  }
  task_queue_urgent.reader = pfVar1;
  memset(&task_queue_urgent.static_queue,0,0xfe0);
  task_queue_urgent.writer = &task_queue_urgent.static_queue;
  task_queue_urgent.reader = &task_queue_urgent.static_queue;
  LOCK();
  task_queue_urgent.lock = '\0';
  UNLOCK();
  return;
}

Assistant:

void fio_defer_clear_queue(void) { fio_defer_clear_tasks(); }